

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolBuilders.cpp
# Opt level: O2

FormalArgumentSymbol * __thiscall
slang::ast::MethodBuilder::copyArg(MethodBuilder *this,FormalArgumentSymbol *fromArg)

{
  DeclaredType *this_00;
  DeclaredType *target;
  FormalArgumentSymbol *arg;
  not_null<slang::ast::DeclaredType_*> local_28;
  FormalArgumentSymbol *local_20;
  
  local_20 = BumpAllocator::
             emplace<slang::ast::FormalArgumentSymbol,std::basic_string_view<char,std::char_traits<char>>const&,slang::SourceLocation_const&,slang::ast::ArgumentDirection_const&,slang::ast::VariableLifetime_const&>
                       (&this->compilation->super_BumpAllocator,
                        &(fromArg->super_VariableSymbol).super_ValueSymbol.super_Symbol.name,
                        &(fromArg->super_VariableSymbol).super_ValueSymbol.super_Symbol.location,
                        &fromArg->direction,&(fromArg->super_VariableSymbol).lifetime);
  (local_20->super_VariableSymbol).flags.m_bits = (fromArg->super_VariableSymbol).flags.m_bits;
  Scope::addMember(&this->symbol->super_Scope,(Symbol *)local_20);
  SmallVectorBase<slang::ast::FormalArgumentSymbol_const*>::
  emplace_back<slang::ast::FormalArgumentSymbol_const*const&>
            ((SmallVectorBase<slang::ast::FormalArgumentSymbol_const*> *)&this->args,&local_20);
  local_28 = ValueSymbol::getDeclaredType((ValueSymbol *)local_20);
  this_00 = not_null<slang::ast::DeclaredType_*>::get(&local_28);
  local_28.ptr = (DeclaredType *)ValueSymbol::getDeclaredType((ValueSymbol *)fromArg);
  target = not_null<const_slang::ast::DeclaredType_*>::get
                     ((not_null<const_slang::ast::DeclaredType_*> *)&local_28);
  DeclaredType::setLink(this_00,target);
  if (target->initializerSyntax != (ExpressionSyntax *)0x0) {
    DeclaredType::setInitializerSyntax
              (this_00,target->initializerSyntax,target->initializerLocation);
  }
  return local_20;
}

Assistant:

FormalArgumentSymbol& MethodBuilder::copyArg(const FormalArgumentSymbol& fromArg) {
    auto arg = compilation.emplace<FormalArgumentSymbol>(fromArg.name, fromArg.location,
                                                         fromArg.direction, fromArg.lifetime);
    arg->flags = fromArg.flags;
    symbol.addMember(*arg);
    args.push_back(arg);

    auto& argDT = *arg->getDeclaredType();
    auto& fromDT = *fromArg.getDeclaredType();
    argDT.setLink(fromDT);

    if (auto expr = fromDT.getInitializerSyntax())
        argDT.setInitializerSyntax(*expr, fromDT.getInitializerLocation());

    return *arg;
}